

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O0

ztresult_t savestack_push(save_stack_t *stack,savestack_entry_t *entry)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *in_RSI;
  long *in_RDI;
  savestack_entry_t *newstack;
  int newallocated;
  int StackGrowthMultiplier;
  int InitialStackSize;
  int local_24;
  
  if (*in_RDI == in_RDI[1] + (long)(int)in_RDI[2] * 0xc) {
    local_24 = (int)in_RDI[2] << 1;
    if (local_24 < 4) {
      local_24 = 4;
    }
    pvVar2 = realloc((void *)in_RDI[1],(long)local_24 * 0xc);
    if (pvVar2 == (void *)0x0) {
      return 0x10;
    }
    *in_RDI = (long)((long)pvVar2 + ((*in_RDI - in_RDI[1]) / 0xc) * 0xc);
    in_RDI[1] = (long)pvVar2;
    *(int *)(in_RDI + 2) = local_24;
  }
  puVar1 = (undefined8 *)*in_RDI;
  *in_RDI = (long)puVar1 + 0xc;
  *puVar1 = *in_RSI;
  *(undefined4 *)(puVar1 + 1) = *(undefined4 *)(in_RSI + 1);
  return 0;
}

Assistant:

static ztresult_t savestack_push(save_stack_t      *stack,
                           const savestack_entry_t *entry)
{
  const int InitialStackSize      = 4; /* initial size in entries */
  const int StackGrowthMultiplier = 2; /* doubling strategy */

  if (stack->sp == stack->stack + stack->allocated)
  {
    int                newallocated;
    savestack_entry_t *newstack;

    newallocated = stack->allocated * StackGrowthMultiplier;
    if (newallocated < InitialStackSize)
      newallocated = InitialStackSize;

    newstack = realloc(stack->stack, newallocated * sizeof(*newstack)); /* FIXME: hoist to a memory manager */
    if (newstack == NULL)
      return ztresult_OOM;

    stack->sp        = newstack + (stack->sp - stack->stack); /* adjust sp */
    stack->stack     = newstack;
    stack->allocated = newallocated;
  }

  *stack->sp++ = *entry;

  return ztresult_OK;
}